

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O3

int main(void)

{
  int *piVar1;
  int iVar2;
  int *dptr;
  int data;
  int *local_48;
  int *local_40;
  int local_38 [2];
  
  local_48 = (int *)CONCAT71(local_48._1_7_,1);
  local_40 = (int *)CONCAT71(local_40._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x161,"int main()",(bool *)&local_48,(bool *)&local_40);
  local_48 = (int *)0x1;
  local_40._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.size())","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x163,"int main()",(unsigned_long *)&local_48,(int *)&local_40);
  local_48 = (int *)0x1;
  local_40 = (int *)CONCAT44(local_40._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.span())","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x164,"int main()",(unsigned_long *)&local_48,(int *)&local_40);
  piVar1 = local_38 + 1;
  local_38[1] = 0x2a;
  local_40 = (int *)0x0;
  local_38[0] = 0;
  local_48 = piVar1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.index())","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x169,"int main()",(unsigned_long *)&local_40,local_38);
  local_40 = (int *)CONCAT44(local_40._4_4_,0x2a);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index()])","42",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x16b,"int main()",piVar1,(int *)&local_40);
  local_40 = piVar1;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[l.index()])","dptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x16d,"int main()",&local_40,&local_48);
  piVar1 = local_48;
  *local_48 = 0x11;
  local_40 = (int *)CONCAT44(local_40._4_4_,0x11);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index()])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x171,"int main()",piVar1,(int *)&local_40);
  test_1d_static<1ul>();
  test_1d_static<30ul>();
  test_1d_dynamic<1ul>();
  test_1d_dynamic<30ul>();
  test_2d_static<1ul,1ul>();
  test_2d_static<30ul,1ul>();
  test_2d_static<1ul,30ul>();
  test_2d_static<30ul,15ul>();
  test_2d_static<15ul,30ul>();
  test_2d_static<30ul,30ul>();
  test_2d_dynamic<1ul,1ul>();
  test_2d_dynamic<30ul,1ul>();
  test_2d_dynamic<1ul,30ul>();
  test_2d_dynamic<30ul,15ul>();
  test_2d_dynamic<15ul,30ul>();
  test_2d_dynamic<30ul,30ul>();
  test_2d_mixed_SD<1ul,1ul>();
  test_2d_mixed_SD<30ul,1ul>();
  test_2d_mixed_SD<1ul,30ul>();
  test_2d_mixed_SD<30ul,15ul>();
  test_2d_mixed_SD<15ul,30ul>();
  test_2d_mixed_SD<30ul,30ul>();
  test_2d_mixed_SD<1ul,1ul>();
  test_2d_mixed_SD<30ul,1ul>();
  test_2d_mixed_SD<1ul,30ul>();
  test_2d_mixed_SD<30ul,15ul>();
  test_2d_mixed_SD<15ul,30ul>();
  test_2d_mixed_SD<30ul,30ul>();
  test_3d_static<1ul,1ul,1ul>();
  test_3d_static<30ul,1ul,1ul>();
  test_3d_static<1ul,30ul,1ul>();
  test_3d_static<1ul,1ul,30ul>();
  test_3d_static<1ul,30ul,30ul>();
  test_3d_static<30ul,1ul,30ul>();
  test_3d_static<30ul,30ul,1ul>();
  test_3d_static<30ul,15ul,15ul>();
  test_3d_static<15ul,30ul,15ul>();
  test_3d_static<15ul,15ul,30ul>();
  test_3d_static<15ul,30ul,30ul>();
  test_3d_static<30ul,15ul,30ul>();
  test_3d_static<30ul,30ul,15ul>();
  test_3d_static<30ul,30ul,30ul>();
  test_3d_dynamic<1ul,1ul,1ul>();
  test_3d_dynamic<30ul,1ul,1ul>();
  test_3d_dynamic<1ul,30ul,1ul>();
  test_3d_dynamic<1ul,1ul,30ul>();
  test_3d_dynamic<1ul,30ul,30ul>();
  test_3d_dynamic<30ul,1ul,30ul>();
  test_3d_dynamic<30ul,30ul,1ul>();
  test_3d_dynamic<30ul,15ul,15ul>();
  test_3d_dynamic<15ul,30ul,15ul>();
  test_3d_dynamic<15ul,15ul,30ul>();
  test_3d_dynamic<15ul,30ul,30ul>();
  test_3d_dynamic<30ul,15ul,30ul>();
  test_3d_dynamic<30ul,30ul,15ul>();
  test_3d_dynamic<30ul,30ul,30ul>();
  iVar2 = boost::report_errors();
  return iVar2;
}

Assistant:

int main()
{
    // Empty
    {
        layout_mapping_left<dimensions<>, dimensions<>, dimensions<> > const l{};

        BOOST_TEST_EQ((l.is_regular()), true);

        BOOST_TEST_EQ((l.size()), 1);
        BOOST_TEST_EQ((l.span()), 1);

        int data = 42;
        int* dptr = &data;

        BOOST_TEST_EQ((l.index()), 0);

        BOOST_TEST_EQ((dptr[l.index()]), 42); 

        BOOST_TEST_EQ(&(dptr[l.index()]), dptr); 

        dptr[l.index()] = 17;

        BOOST_TEST_EQ((dptr[l.index()]), 17); 
    }

    // 1D Static
    test_1d_static<1 >();
    test_1d_static<30>();

    // 1D Dynamic
    test_1d_dynamic<1 >();
    test_1d_dynamic<30>();

    // 2D Static
    test_2d_static<1,  1 >();

    test_2d_static<30, 1 >();
    test_2d_static<1,  30>();

    test_2d_static<30, 15>();
    test_2d_static<15, 30>();

    test_2d_static<30, 30>();

    // 2D Dynamic
    test_2d_dynamic<1,  1 >();

    test_2d_dynamic<30, 1 >();
    test_2d_dynamic<1,  30>();

    test_2d_dynamic<30, 15>();
    test_2d_dynamic<15, 30>();

    test_2d_dynamic<30, 30>();

    // 2D Mixed - A[dynamic][static]
    test_2d_mixed_SD<1,  1 >();

    test_2d_mixed_SD<30, 1 >();
    test_2d_mixed_SD<1,  30>();

    test_2d_mixed_SD<30, 15>();
    test_2d_mixed_SD<15, 30>();

    test_2d_mixed_SD<30, 30>();

    // 2D Mixed - A[static][dynamic]
    test_2d_mixed_SD<1,  1 >();

    test_2d_mixed_SD<30, 1 >();
    test_2d_mixed_SD<1,  30>();

    test_2d_mixed_SD<30, 15>();
    test_2d_mixed_SD<15, 30>();

    test_2d_mixed_SD<30, 30>();

    // 3D Static
    test_3d_static<1,  1,  1 >();

    test_3d_static<30, 1,  1 >();
    test_3d_static<1,  30, 1 >();
    test_3d_static<1,  1,  30>();

    test_3d_static<1,  30, 30>();
    test_3d_static<30, 1,  30>();
    test_3d_static<30, 30, 1 >();

    test_3d_static<30, 15, 15>();
    test_3d_static<15, 30, 15>();
    test_3d_static<15, 15, 30>();

    test_3d_static<15, 30, 30>();
    test_3d_static<30, 15, 30>();
    test_3d_static<30, 30, 15>();

    test_3d_static<30, 30, 30>();

    // 3D Dynamic
    test_3d_dynamic<1,  1,  1 >();

    test_3d_dynamic<30, 1,  1 >();
    test_3d_dynamic<1,  30, 1 >();
    test_3d_dynamic<1,  1,  30>();

    test_3d_dynamic<1,  30, 30>();
    test_3d_dynamic<30, 1,  30>();
    test_3d_dynamic<30, 30, 1 >();

    test_3d_dynamic<30, 15, 15>();
    test_3d_dynamic<15, 30, 15>();
    test_3d_dynamic<15, 15, 30>();

    test_3d_dynamic<15, 30, 30>();
    test_3d_dynamic<30, 15, 30>();
    test_3d_dynamic<30, 30, 15>();

    test_3d_dynamic<30, 30, 30>();

    return boost::report_errors();
}